

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O0

string * __thiscall
duckdb::SQLLogicTestRunner::ReplaceKeywords(SQLLogicTestRunner *this,string *input)

{
  bool bVar1;
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd08;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
  *in_stack_fffffffffffffd10;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  allocator local_271;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [55];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  reference local_40;
  reference local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_28;
  long local_20;
  
  local_20 = in_RSI + 0xf8;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_fffffffffffffd08);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffd08);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_40 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                            *)0x7c944c);
    local_48 = &local_40->second;
    local_38 = local_40;
    std::__cxx11::string::string(local_88,in_RDX);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"${%s}",&local_c9);
    std::__cxx11::string::string(local_100,(string *)local_40);
    StringUtil::Format<std::__cxx11::string>(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    duckdb::StringUtil::Replace(local_68,local_88,local_a8,local_48);
    std::__cxx11::string::operator=(in_RDX,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_88);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator++(in_stack_fffffffffffffd10);
  }
  std::__cxx11::string::string(local_140,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"__TEST_DIR__",&local_161);
  TestDirectoryPath_abi_cxx11_();
  duckdb::StringUtil::Replace(local_120,local_140,local_160,local_188);
  std::__cxx11::string::operator=(in_RDX,local_120);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::string(local_1c8,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"__WORKING_DIRECTORY__",&local_1e9);
  duckdb::FileSystem::GetWorkingDirectory_abi_cxx11_();
  duckdb::StringUtil::Replace(local_1a8,local_1c8,local_1e8,local_210);
  std::__cxx11::string::operator=(in_RDX,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::string(local_250,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"__BUILD_DIRECTORY__",&local_271);
  paVar2 = (allocator *)&stack0xfffffffffffffd67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffd68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/build_O0",
             paVar2);
  duckdb::StringUtil::Replace(local_230,local_250,local_270,&stack0xfffffffffffffd68);
  std::__cxx11::string::operator=(in_RDX,local_230);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd67);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

string SQLLogicTestRunner::ReplaceKeywords(string input) {
	// Replace environment variables in the SQL
	for (auto &it : environment_variables) {
		auto &name = it.first;
		auto &value = it.second;
		input = StringUtil::Replace(input, StringUtil::Format("${%s}", name), value);
	}
	input = StringUtil::Replace(input, "__TEST_DIR__", TestDirectoryPath());
	input = StringUtil::Replace(input, "__WORKING_DIRECTORY__", FileSystem::GetWorkingDirectory());
	input = StringUtil::Replace(input, "__BUILD_DIRECTORY__", DUCKDB_BUILD_DIRECTORY);
	return input;
}